

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::anon_unknown_0::xml_buffered_writer::flush
          (xml_buffered_writer *this,char_t *data,size_t size)

{
  xml_encoding xVar1;
  xml_encoding xVar2;
  size_t sVar3;
  size_t result;
  size_t size_local;
  char_t *data_local;
  xml_buffered_writer *this_local;
  
  if (size != 0) {
    xVar1 = this->encoding;
    xVar2 = get_write_native_encoding();
    if (xVar1 == xVar2) {
      (*this->writer->_vptr_xml_writer[2])(this->writer,data,size);
    }
    else {
      sVar3 = convert_buffer_output
                        ((this->scratch).data_char,(this->scratch).data_u8,(this->scratch).data_u16,
                         (this->scratch).data_u32,data,size,this->encoding);
      if (0x2000 < sVar3) {
        __assert_fail("result <= sizeof(scratch)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JeffIrwin[P]maph/submodules/colormapper/submodules/pugixml/src/pugixml.cpp"
                      ,0xe89,
                      "void pugi::impl::(anonymous namespace)::xml_buffered_writer::flush(const char_t *, size_t)"
                     );
      }
      (*this->writer->_vptr_xml_writer[2])(this->writer,&this->scratch,sVar3);
    }
  }
  return;
}

Assistant:

void flush(const char_t* data, size_t size)
		{
			if (size == 0) return;

			// fast path, just write data
			if (encoding == get_write_native_encoding())
				writer.write(data, size * sizeof(char_t));
			else
			{
				// convert chunk
				size_t result = convert_buffer_output(scratch.data_char, scratch.data_u8, scratch.data_u16, scratch.data_u32, data, size, encoding);
				assert(result <= sizeof(scratch));

				// write data
				writer.write(scratch.data_u8, result);
			}
		}